

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_function_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,TextureFunctionNameArguments *args)

{
  uint32_t id;
  Dim DVar1;
  SPIRType *type;
  bool bVar2;
  CompilerError *pCVar3;
  byte bVar4;
  allocator local_71;
  string fname;
  string local_50;
  
  if (args->has_min_lod == true) {
    if ((this->options).es == true) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&fname,"Sparse residency is not supported in ESSL.",
                 (allocator *)&local_50);
      CompilerError::CompilerError(pCVar3,&fname);
      __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::string
              ((string *)&fname,"GL_ARB_sparse_texture_clamp",(allocator *)&local_50);
    require_extension_internal(this,&fname);
    ::std::__cxx11::string::~string((string *)&fname);
  }
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  type = (args->base).imgtype;
  id = (args->base).img.id;
  DVar1 = (type->image).dim;
  if (((((byte)(DVar1 == DimCube | DVar1 == Dim2D & (type->image).arrayed) == 1) &&
       (bVar2 = Compiler::is_depth_image(&this->super_Compiler,type,id), bVar2)) && (args->lod != 0)
      ) && ((args->base).is_fetch == false)) {
    bVar2 = expression_is_constant_null(this,args->lod);
    bVar4 = 1;
    if (!bVar2) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,
                 "textureLod on sampler2DArrayShadow is not constant 0.0. This cannot be expressed in GLSL."
                 ,&local_71);
      CompilerError::CompilerError(pCVar3,&local_50);
      __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    bVar4 = 0;
  }
  if (args->is_sparse_feedback == true) {
    ::std::__cxx11::string::append((char *)&fname);
  }
  if ((args->base).is_fetch != true) {
    ::std::__cxx11::string::append((char *)&fname);
    if ((args->base).is_gather == true) {
      ::std::__cxx11::string::append((char *)&fname);
    }
    if (args->has_array_offsets == true) {
      ::std::__cxx11::string::append((char *)&fname);
    }
    if ((args->base).is_proj == true) {
      ::std::__cxx11::string::append((char *)&fname);
    }
    if ((args->has_grad | bVar4) == 1) {
      ::std::__cxx11::string::append((char *)&fname);
    }
    if (bVar4 != 0 || args->lod == 0) goto LAB_0026b849;
  }
  ::std::__cxx11::string::append((char *)&fname);
LAB_0026b849:
  if (args->has_offset == true) {
    ::std::__cxx11::string::append((char *)&fname);
  }
  if (args->has_min_lod == true) {
    ::std::__cxx11::string::append((char *)&fname);
  }
  if ((args->is_sparse_feedback != false) || (args->has_min_lod == true)) {
    ::std::__cxx11::string::append((char *)&fname);
  }
  bVar2 = is_legacy(this);
  if ((bVar2) && ((args->base).is_gather == false)) {
    legacy_tex_op(__return_storage_ptr__,this,&fname,type,id);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&fname);
  }
  ::std::__cxx11::string::~string((string *)&fname);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_function_name(const TextureFunctionNameArguments &args)
{
	if (args.has_min_lod)
	{
		if (options.es)
			SPIRV_CROSS_THROW("Sparse residency is not supported in ESSL.");
		require_extension_internal("GL_ARB_sparse_texture_clamp");
	}

	string fname;
	auto &imgtype = *args.base.imgtype;
	VariableID tex = args.base.img;

	// textureLod on sampler2DArrayShadow and samplerCubeShadow does not exist in GLSL for some reason.
	// To emulate this, we will have to use textureGrad with a constant gradient of 0.
	// The workaround will assert that the LOD is in fact constant 0, or we cannot emit correct code.
	// This happens for HLSL SampleCmpLevelZero on Texture2DArray and TextureCube.
	bool workaround_lod_array_shadow_as_grad = false;
	if (((imgtype.image.arrayed && imgtype.image.dim == Dim2D) || imgtype.image.dim == DimCube) &&
	    is_depth_image(imgtype, tex) && args.lod && !args.base.is_fetch)
	{
		if (!expression_is_constant_null(args.lod))
		{
			SPIRV_CROSS_THROW("textureLod on sampler2DArrayShadow is not constant 0.0. This cannot be "
			                  "expressed in GLSL.");
		}
		workaround_lod_array_shadow_as_grad = true;
	}

	if (args.is_sparse_feedback)
		fname += "sparse";

	if (args.base.is_fetch)
		fname += args.is_sparse_feedback ? "TexelFetch" : "texelFetch";
	else
	{
		fname += args.is_sparse_feedback ? "Texture" : "texture";

		if (args.base.is_gather)
			fname += "Gather";
		if (args.has_array_offsets)
			fname += "Offsets";
		if (args.base.is_proj)
			fname += "Proj";
		if (args.has_grad || workaround_lod_array_shadow_as_grad)
			fname += "Grad";
		if (args.lod != 0 && !workaround_lod_array_shadow_as_grad)
			fname += "Lod";
	}

	if (args.has_offset)
		fname += "Offset";

	if (args.has_min_lod)
		fname += "Clamp";

	if (args.is_sparse_feedback || args.has_min_lod)
		fname += "ARB";

	return (is_legacy() && !args.base.is_gather) ? legacy_tex_op(fname, imgtype, tex) : fname;
}